

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O0

void __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::
PipelineStateBase<Diligent::GraphicsPipelineStateCreateInfo>
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this,IReferenceCounters *pRefCounters,
          RenderDeviceImplType *pDevice,GraphicsPipelineStateCreateInfo *CreateInfo,
          bool bIsDeviceInternal)

{
  PSO_CREATE_INTERNAL_FLAGS PVar1;
  RenderDeviceVkImpl *pRVar2;
  Char *Message;
  bool local_71;
  char (*local_70) [36];
  undefined1 local_68 [8];
  string msg;
  Uint64 DeviceQueuesMask;
  bool bIsDeviceInternal_local;
  GraphicsPipelineStateCreateInfo *CreateInfo_local;
  RenderDeviceImplType *pDevice_local;
  IReferenceCounters *pRefCounters_local;
  PipelineStateBase<Diligent::EngineVkImplTraits> *this_local;
  
  DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
  ::DeviceObjectBase(&this->
                      super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                     ,pRefCounters,pDevice,(PipelineStateDesc *)CreateInfo,bIsDeviceInternal);
  (this->
  super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
  ).super_ObjectBase<Diligent::IPipelineStateVk>.super_RefCountedObject<Diligent::IPipelineStateVk>.
  super_IPipelineStateVk.super_IPipelineState.super_IDeviceObject.super_IObject =
       (IObject)&PTR_QueryInterface_010d1548;
  std::unique_ptr<Diligent::AsyncInitializer,std::default_delete<Diligent::AsyncInitializer>>::
  unique_ptr<std::default_delete<Diligent::AsyncInitializer>,void>
            ((unique_ptr<Diligent::AsyncInitializer,std::default_delete<Diligent::AsyncInitializer>>
              *)&this->m_AsyncInitializer);
  this->m_ActiveShaderStages = SHADER_TYPE_UNKNOWN;
  local_71 = true;
  if (((CreateInfo->super_PipelineStateCreateInfo).ppResourceSignatures !=
       (IPipelineResourceSignature **)0x0) &&
     (local_71 = true, (CreateInfo->super_PipelineStateCreateInfo).ResourceSignaturesCount != 0)) {
    PVar1 = GetInternalCreateFlags(&CreateInfo->super_PipelineStateCreateInfo);
    PVar1 = Diligent::operator&(PVar1,PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0);
    local_71 = PVar1 != PSO_CREATE_INTERNAL_FLAG_NONE;
  }
  this->m_UsingImplicitSignature = local_71;
  std::atomic<Diligent::PIPELINE_STATE_STATUS>::atomic
            (&this->m_Status,PIPELINE_STATE_STATUS_UNINITIALIZED);
  this->m_SignatureCount = '\0';
  this->m_Signatures = (SignatureAutoPtrType *)0x0;
  (this->field_6).m_pGraphicsPipelineData = (GraphicsPipelineData *)0x0;
  this->m_IsDestructed = false;
  pRVar2 = DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
           ::GetDevice(&this->
                        super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                      );
  ValidatePSOCreateInfo<Diligent::GraphicsPipelineStateCreateInfo>
            ((IRenderDevice *)pRVar2,CreateInfo);
  pRVar2 = DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
           ::GetDevice(&this->
                        super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                      );
  msg.field_2._8_8_ =
       RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
       ::GetCommandQueueMask
                 (&pRVar2->
                   super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                 );
  if (((this->
       super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
       ).m_Desc.ImmediateContextMask & msg.field_2._8_8_) == 0) {
    pRVar2 = DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
             ::GetDevice(&this->
                          super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                        );
    local_70 = (char (*) [36])
               RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
               ::GetCommandQueueCount
                         (&pRVar2->
                           super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                         );
    FormatString<char[34],std::ios_base&(std::ios_base&),unsigned_long,char[24],unsigned_long,char[36]>
              ((string *)local_68,(Diligent *)"No bits in the immediate mask (0x",
               (char (*) [34])std::hex,
               (_func_ios_base_ptr_ios_base_ptr *)
               &(this->
                super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                ).m_Desc.ImmediateContextMask,(unsigned_long *)") correspond to one of ",
               (char (*) [24])&local_70,(unsigned_long *)" available software command queues.",
               local_70);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"PipelineStateBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x1a2);
    std::__cxx11::string::~string((string *)local_68);
  }
  (this->
  super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
  ).m_Desc.ImmediateContextMask =
       msg.field_2._8_8_ &
       (this->
       super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
       ).m_Desc.ImmediateContextMask;
  return;
}

Assistant:

PipelineStateBase(IReferenceCounters*      pRefCounters,
                      RenderDeviceImplType*    pDevice,
                      const PSOCreateInfoType& CreateInfo,
                      bool                     bIsDeviceInternal = false) :
        TDeviceObjectBase{pRefCounters, pDevice, CreateInfo.PSODesc, bIsDeviceInternal},
        m_UsingImplicitSignature{CreateInfo.ppResourceSignatures == nullptr ||
                                 CreateInfo.ResourceSignaturesCount == 0 ||
                                 (GetInternalCreateFlags(CreateInfo) & PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0) != 0}
    {
        try
        {
            ValidatePSOCreateInfo(this->GetDevice(), CreateInfo);

            Uint64 DeviceQueuesMask = this->GetDevice()->GetCommandQueueMask();
            DEV_CHECK_ERR((this->m_Desc.ImmediateContextMask & DeviceQueuesMask) != 0,
                          "No bits in the immediate mask (0x", std::hex, this->m_Desc.ImmediateContextMask,
                          ") correspond to one of ", this->GetDevice()->GetCommandQueueCount(), " available software command queues.");
            this->m_Desc.ImmediateContextMask &= DeviceQueuesMask;
        }
        catch (...)
        {
            Destruct();
            throw;
        }
    }